

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O2

half Imf_2_5::floatToHalf(float f)

{
  unsigned_short uVar1;
  half local_a;
  
  if (((uint)ABS(f) < 0x7f800000) &&
     ((uVar1 = 0x7c00, 65504.0 < f || (uVar1 = 0xfc00, f < -65504.0)))) {
    return (half)uVar1;
  }
  half::half(&local_a,f);
  return (half)local_a._h;
}

Assistant:

half	
floatToHalf (float f)
{
    if (isFinite (f))
    {
	if (f >  HALF_MAX)
	    return half::posInf();

	if (f < -HALF_MAX)
	    return half::negInf();
    }

    return half (f);
}